

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

ssize_t __thiscall
TestWaitingLogSink::send(TestWaitingLogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  undefined4 extraout_var;
  ssize_t sVar2;
  int in_R9D;
  tm *in_stack_00000008;
  char *in_stack_00000010;
  _Alloc_hider in_stack_ffffffffffffffb0;
  
  __thread1 = this->tid_;
  __thread2 = pthread_self();
  iVar1 = pthread_equal(__thread1,__thread2);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (iVar1 != 0) {
    google::LogSink::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffffb0,(LogSink *)(ulong)(uint)__fd,(LogSeverity)__n,
               (char *)(ulong)(uint)__flags,in_R9D,in_stack_00000008,in_stack_00000010,
               (size_t)in_stack_ffffffffffffffb0._M_p);
    TestLogSinkWriter::Buffer(&this->writer_,(string *)&stack0xffffffffffffffb0);
    sVar2 = std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  return sVar2;
}

Assistant:

virtual void send(LogSeverity severity, const char* /* full_filename */,
                    const char* base_filename, int line,
                    const struct tm* tm_time,
                    const char* message, size_t message_len) {
    // Push it to Writer thread if we are the original logging thread.
    // Note: Something like ThreadLocalLogSink is a better choice
    //       to do thread-specific LogSink logic for real.
    if (pthread_equal(tid_, pthread_self())) {
      writer_.Buffer(ToString(severity, base_filename, line,
                              tm_time, message, message_len));
    }
  }